

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O2

string * stringformat<std::__cxx11::string>
                   (string *__return_storage_ptr__,char *fmt,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  stringstream buf;
  StringFormatter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1d8.fmt = fmt;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8.args,
             args);
  StringFormatter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::tostream(&local_1d8,local_1a0);
  std::__cxx11::string::~string((string *)&local_1d8.args);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string stringformat(const char *fmt, ARGS&&...args)
{
    std::stringstream buf;
    buf << StringFormatter<ARGS...>(fmt, std::forward<ARGS>(args)...);

    return buf.str();
}